

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

bool_t BufferToBase64(tchar_t *Out,size_t OutLen,uint8_t *Buffer,size_t BufferSize)

{
  tchar_t tVar1;
  ulong local_30;
  size_t BufferSize_local;
  uint8_t *Buffer_local;
  size_t OutLen_local;
  tchar_t *Out_local;
  
  BufferSize_local = (size_t)Buffer;
  Buffer_local = (uint8_t *)OutLen;
  OutLen_local = (size_t)Out;
  for (local_30 = BufferSize; 2 < local_30 && (uint8_t *)0x4 < Buffer_local; local_30 = local_30 - 3
      ) {
    tVar1 = Base64Char((int)(uint)*(byte *)BufferSize_local >> 2);
    *(tchar_t *)OutLen_local = tVar1;
    tVar1 = Base64Char((*(byte *)BufferSize_local & 3) << 4 |
                       (int)(uint)*(byte *)(BufferSize_local + 1) >> 4);
    *(tchar_t *)(OutLen_local + 1) = tVar1;
    tVar1 = Base64Char((*(byte *)(BufferSize_local + 1) & 0xf) << 2 |
                       (int)(uint)*(byte *)(BufferSize_local + 2) >> 6);
    *(tchar_t *)(OutLen_local + 2) = tVar1;
    tVar1 = Base64Char(*(byte *)(BufferSize_local + 2) & 0x3f);
    *(tchar_t *)(OutLen_local + 3) = tVar1;
    BufferSize_local = BufferSize_local + 3;
    Buffer_local = Buffer_local + -4;
    OutLen_local = OutLen_local + 4;
  }
  if (local_30 != 0) {
    if (Buffer_local < (uint8_t *)0x5) {
      return 0;
    }
    tVar1 = Base64Char((int)(uint)*(byte *)BufferSize_local >> 2);
    *(tchar_t *)OutLen_local = tVar1;
    if (local_30 == 1) {
      tVar1 = Base64Char((*(byte *)BufferSize_local & 3) << 4);
      *(tchar_t *)(OutLen_local + 1) = tVar1;
      *(undefined1 *)(OutLen_local + 2) = 0x3d;
      local_30 = -1;
    }
    else {
      tVar1 = Base64Char((*(byte *)BufferSize_local & 3) << 4 |
                         (int)(uint)*(byte *)(BufferSize_local + 1) >> 4);
      *(tchar_t *)(OutLen_local + 1) = tVar1;
      if (local_30 == 2) {
        tVar1 = Base64Char((*(byte *)(BufferSize_local + 1) & 0xf) << 2);
        *(tchar_t *)(OutLen_local + 2) = tVar1;
        local_30 = local_30 - 3;
      }
      else {
        tVar1 = Base64Char((*(byte *)(BufferSize_local + 1) & 0xf) << 2 |
                           (int)(uint)*(byte *)(BufferSize_local + 2) >> 6);
        *(tchar_t *)(OutLen_local + 2) = tVar1;
        local_30 = local_30 - 3;
      }
    }
    if (local_30 == -1) {
      *(undefined1 *)(OutLen_local + 3) = 0x3d;
    }
    else {
      tVar1 = Base64Char(*(byte *)(BufferSize_local + 2) & 0x3f);
      *(tchar_t *)(OutLen_local + 3) = tVar1;
    }
    OutLen_local = OutLen_local + 4;
  }
  *(undefined1 *)OutLen_local = 0;
  return 1;
}

Assistant:

bool_t BufferToBase64(tchar_t *Out, size_t OutLen, const uint8_t *Buffer, size_t BufferSize)
{
    while (BufferSize >= 3 && OutLen > 4) // treat packets of 3 bytes at once
    {
        Out[0] = Base64Char(Buffer[0] >> 2);
        Out[1] = Base64Char(((Buffer[0]&0x03)<<4) | (Buffer[1]>>4));
        Out[2] = Base64Char(((Buffer[1]&0x0F)<<2) | (Buffer[2]>>6));
        Out[3] = Base64Char(Buffer[2]&0x3F);
        BufferSize -= 3;
        Buffer += 3;
        OutLen -= 4;
        Out += 4;
    }

    if (BufferSize--)
    {
        if (OutLen < 5)
            return 0; // not enough room in the output buffer
        Out[0] = Base64Char(Buffer[0] >> 2);

        if (BufferSize--)
            Out[1] = Base64Char(((Buffer[0]&0x03)<<4) | (Buffer[1]>>4));
        else
            Out[1] = Base64Char((Buffer[0]&0x03)<<4);

        if (BufferSize == (size_t)-1)
            Out[2] = '=';
        else if (BufferSize--)
            Out[2] = Base64Char(((Buffer[1]&0x0F)<<2) | (Buffer[2]>>6));
        else
            Out[2] = Base64Char((Buffer[1]&0x0F)<<2);

        if (BufferSize == (size_t)-1)
            Out[3] = '=';
        else
            Out[3] = Base64Char(Buffer[2]&0x3F);
        Out += 4;
    }
    Out[0] = 0;
    return 1;
}